

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_mtbdd.c
# Opt level: O2

void mtbdd_writer_writetext(FILE *out,sylvan_skiplist_t sl)

{
  uint8_t *puVar1;
  ulong uVar2;
  size_t sVar3;
  MTBDD MVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  size_t i;
  ulong index;
  char *pcVar7;
  long lVar8;
  
  fwrite("[\n",2,1,(FILE *)out);
  sVar3 = sylvan_skiplist_count(sl);
  for (index = 1; index <= sVar3; index = index + 1) {
    MVar4 = sylvan_skiplist_getr(sl,index);
    puVar1 = nodes->data;
    lVar8 = (MVar4 & 0xffffffffff) * 0x10;
    if ((*(ulong *)(puVar1 + lVar8) >> 0x3e & 1) == 0) {
      uVar5 = sylvan_skiplist_get(sl,*(ulong *)(puVar1 + lVar8 + 8) & 0xffffffffff);
      uVar2 = *(ulong *)(puVar1 + lVar8);
      uVar6 = sylvan_skiplist_get(sl,uVar2 & 0xffffffffff);
      pcVar7 = "~";
      if (-1 < (long)(uVar2 ^ uVar6)) {
        pcVar7 = "";
      }
      fprintf((FILE *)out,"  node(%zu,%u,%zu,%s%zu),\n",index,*(ulong *)(puVar1 + lVar8 + 8) >> 0x28
              ,uVar5,pcVar7,uVar6 & 0x7fffffffffffffff);
    }
    else {
      fprintf((FILE *)out,"  leaf(%zu,%u,\"",index);
      mtbdd_fprint_leaf(out,MVar4 & 0x7fffffffffffffff);
      fwrite("\"),\n",4,1,(FILE *)out);
    }
  }
  fputc(0x5d,(FILE *)out);
  return;
}

Assistant:

void
mtbdd_writer_writetext(FILE *out, sylvan_skiplist_t sl)
{
    fprintf(out, "[\n");
    size_t nodecount = sylvan_skiplist_count(sl);
    for (size_t i=1; i<=nodecount; i++) {
        MTBDD dd = sylvan_skiplist_getr(sl, i);

        mtbddnode_t n = MTBDD_GETNODE(dd);
        if (mtbddnode_isleaf(n)) {
            /* serialize leaf, does not support customs yet */
            fprintf(out, "  leaf(%zu,%u,\"", i, mtbddnode_gettype(n));
            mtbdd_fprint_leaf(out, MTBDD_STRIPMARK(dd));
            fprintf(out, "\"),\n");
        } else {
            MTBDD low = sylvan_skiplist_get(sl, mtbddnode_getlow(n));
            MTBDD high = mtbddnode_gethigh(n);
            high = MTBDD_TRANSFERMARK(high, sylvan_skiplist_get(sl, MTBDD_STRIPMARK(high)));
            fprintf(out, "  node(%zu,%u,%zu,%s%zu),\n", i, mtbddnode_getvariable(n), (size_t)low, MTBDD_HASMARK(high)?"~":"", (size_t)MTBDD_STRIPMARK(high));
        }
    }

    fprintf(out, "]");
}